

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_Join::test_method(util_Join *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long *plVar4;
  long lVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_02;
  const_string file_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  allocator_type local_191;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  lazy_ostream local_130;
  undefined1 *local_120;
  char **local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined **local_108;
  undefined1 local_100;
  undefined1 *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *local_e0;
  undefined1 local_d8 [8];
  element_type *peStack_d0;
  shared_count local_c8 [2];
  undefined1 local_b8 [32];
  long *local_98 [2];
  long local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11b;
  file.m_begin = (iterator)&local_148;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  local_130.m_empty = false;
  local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = (char **)0xf4aea1;
  local_d8 = (undefined1  [8])0x0;
  peStack_d0 = (element_type *)0x0;
  local_c8[0].pi_ = (sp_counted_base *)0x0;
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (util *)local_d8,", ");
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "");
  local_78._M_dataplus._M_p._0_1_ = iVar1 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_190._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0xf4a348;
  local_190._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0xf4a3ab;
  local_b8._24_8_ = &local_e8;
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf4aea1;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01389558;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_130,1,2,REQUIRE,0xf4a9c9,(size_t)&local_190,0x11b,
             local_b8,"\"\"",&local_108);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x11c;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_130.m_empty = false;
  local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = (char **)0xf4aea1;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"foo","");
  __l._M_len = 1;
  __l._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_190,__l,&local_191);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (util *)&local_190,", ");
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "foo");
  local_d8[0] = iVar1 == 0;
  peStack_d0 = (element_type *)0x0;
  local_c8[0].pi_ = (sp_counted_base *)0x0;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf4a348;
  local_e0 = "";
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = &local_110;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_138;
  local_138 = "foo";
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01389718;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,&local_130,1,2,REQUIRE,0xf4a9f0,(size_t)&local_e8,0x11c,
             local_b8,"\"foo\"",&local_108);
  boost::detail::shared_count::~shared_count(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11d;
  file_01.m_begin = (iterator)&local_1a8;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b8,
             msg_01);
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_01388f08;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"foo","");
  plVar4 = local_88;
  local_98[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"bar","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_190,__l_00,&local_191);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_78,(util *)&local_190,", ");
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"foo, bar");
  local_d8[0] = iVar1 == 0;
  peStack_d0 = (element_type *)0x0;
  local_c8[0].pi_ = (sp_counted_base *)0x0;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf4a348;
  local_e0 = "";
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01388fc8;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  local_138 = "foo, bar";
  local_130.m_empty = false;
  local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013896d8;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_110 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,(lazy_ostream *)local_58,1,2,REQUIRE,0xf4aa22,
             (size_t)&local_e8,0x11d,&local_108,"\"foo, bar\"",&local_130);
  boost::detail::shared_count::~shared_count(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_190);
  lVar5 = -0x40;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x121;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  local_130.m_empty = false;
  local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = (char **)0xf4aea1;
  local_c8[0].pi_ = (sp_counted_base *)0x0;
  local_d8 = (undefined1  [8])local_d8;
  peStack_d0 = (element_type *)local_d8;
  util::
  Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (util *)local_d8);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "");
  local_78._M_dataplus._M_p._0_1_ = iVar1 == 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_190._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0xf4a348;
  local_190._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0xf4a3ab;
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = &local_e8;
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf4aea1;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01389558;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,&local_130,1,2,REQUIRE,0xf4aa69,(size_t)&local_190,0x121,
             local_b8,"\"\"",&local_108);
  this_00 = &local_78.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x122;
  file_03.m_begin = (iterator)&local_1e8;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
             msg_03);
  local_130.m_empty = false;
  local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = (char **)0xf4aea1;
  local_78._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"foo","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_78;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_190,__l_01,&local_191);
  util::
  Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (util *)&local_190);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "FOO");
  local_d8[0] = iVar1 == 0;
  peStack_d0 = (element_type *)0x0;
  local_c8[0].pi_ = (sp_counted_base *)0x0;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf4a348;
  local_e0 = "";
  local_b8[8] = 0;
  local_b8._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = &local_110;
  local_138 = "FOO";
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01389718;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_138;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,&local_130,1,2,REQUIRE,0xf4aa98,(size_t)&local_e8,0x122,
             local_b8,"\"FOO\"",&local_108);
  boost::detail::shared_count::~shared_count(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != this_00) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x123;
  file_04.m_begin = (iterator)&local_208;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_218,
             msg_04);
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_01388f08;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"foo","");
  plVar4 = local_88;
  local_98[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"bar","");
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_b8;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_190,__l_02,&local_191);
  util::
  Join<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util_tests::util_Join::test_method()::__0>
            (&local_78,(util *)&local_190);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"FOO, BAR");
  local_d8[0] = iVar1 == 0;
  peStack_d0 = (element_type *)0x0;
  local_c8[0].pi_ = (sp_counted_base *)0x0;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf4a348;
  local_e0 = "";
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01388fc8;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = &local_110;
  local_138 = "FOO, BAR";
  local_130.m_empty = false;
  local_130._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013896d8;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_110 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_d8,(lazy_ostream *)local_58,1,2,REQUIRE,0xf4aad6,
             (size_t)&local_e8,0x123,&local_108,"\"FOO, BAR\"",&local_130);
  boost::detail::shared_count::~shared_count(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != this_00) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_190);
  lVar5 = -0x40;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_Join)
{
    // Normal version
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{}, ", "), "");
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{"foo"}, ", "), "foo");
    BOOST_CHECK_EQUAL(Join(std::vector<std::string>{"foo", "bar"}, ", "), "foo, bar");

    // Version with unary operator
    const auto op_upper = [](const std::string& s) { return ToUpper(s); };
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{}, ", ", op_upper), "");
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{"foo"}, ", ", op_upper), "FOO");
    BOOST_CHECK_EQUAL(Join(std::list<std::string>{"foo", "bar"}, ", ", op_upper), "FOO, BAR");
}